

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O0

int fld_eq(limb_t *a,limb_t *b)

{
  limb_t *in_RSI;
  limb_t *in_RDI;
  int i;
  limb_t res;
  fld_t tmp;
  int local_44;
  ulong local_40;
  ulong local_38 [7];
  
  fld_sub((limb_t *)local_38,in_RDI,in_RSI);
  fld_reduce((limb_t *)local_38,(limb_t *)local_38);
  local_40 = local_38[0];
  for (local_44 = 1; local_44 < 5; local_44 = local_44 + 1) {
    local_40 = local_38[local_44] | local_40;
  }
  for (local_44 = 0x20; local_44 != 0; local_44 = local_44 >> 1) {
    local_40 = (long)local_40 >> (sbyte)local_44 | local_40;
  }
  return ((uint)local_40 ^ 0xffffffff) & 1;
}

Assistant:

int
fld_eq(const fld_t a, const fld_t b)
{
	fld_t tmp;
	limb_t res;
	int i;

	/* tmp <- a - b */
	fld_sub(tmp, a, b);
	fld_reduce(tmp, tmp);

	/* and check tmp for zero */
	res = tmp[0];
	for (i = 1; i < FLD_LIMB_NUM; i++)
		res |= tmp[i];
	for (i = 4*sizeof(limb_t); i > 0; i >>= 1)
                res |= res >> i;

	/* now (res & 1) is zero iff tmp is zero */
	res = ~res & 1;

	return res;
}